

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1532.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  CURLcode CVar2;
  undefined8 uVar3;
  CURLcode ec_1;
  CURLcode ec;
  int res;
  long httpcode;
  CURL *curl;
  char *URL_local;
  
  ec_1 = CURLE_OK;
  curl = (CURL *)URL;
  CVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (CVar2 != CURLE_OK) {
    uVar3 = curl_easy_strerror(CVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1532.c"
                  ,0x22,CVar2,uVar3);
    ec_1 = CVar2;
  }
  if (ec_1 == CURLE_OK) {
    httpcode = curl_easy_init();
    if (httpcode == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1532.c"
                    ,0x24);
      ec_1 = CURLE_USE_SSL_FAILED|CURLE_PEER_FAILED_VERIFICATION;
    }
    if (ec_1 == CURLE_OK) {
      CVar2 = curl_easy_setopt(httpcode,0x2712,curl);
      uVar1 = _stderr;
      if (CVar2 != CURLE_OK) {
        uVar3 = curl_easy_strerror(CVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1532.c"
                      ,0x26,CVar2,uVar3);
        ec_1 = CVar2;
      }
      if (ec_1 == CURLE_OK) {
        ec_1 = curl_easy_perform(httpcode);
        uVar1 = _stderr;
        if (ec_1 == CURLE_OK) {
          ec_1 = curl_easy_getinfo(httpcode,0x200002,&ec);
          uVar1 = _stderr;
          if (ec_1 == CURLE_OK) {
            if (_ec == 200) {
              curl_easy_reset(httpcode);
              ec_1 = curl_easy_getinfo(httpcode,0x200002,&ec);
              uVar1 = _stderr;
              if (ec_1 == CURLE_OK) {
                if (_ec != 0) {
                  curl_mfprintf(_stderr,
                                "%s:%d curl_easy_reset failed to zero the response code\npossible regression of github bug 1017\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1532.c"
                                ,0x47);
                  ec_1 = CURLE_HTTP_RETURNED_ERROR;
                }
              }
              else {
                uVar3 = curl_easy_strerror(ec_1);
                curl_mfprintf(uVar1,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1532.c"
                              ,0x42,ec_1,uVar3);
              }
            }
            else {
              curl_mfprintf(_stderr,"%s:%d unexpected response code %ld\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1532.c"
                            ,0x37,_ec);
              ec_1 = CURLE_HTTP_RETURNED_ERROR;
            }
          }
          else {
            uVar3 = curl_easy_strerror(ec_1);
            curl_mfprintf(uVar1,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1532.c"
                          ,0x32,ec_1,uVar3);
          }
        }
        else {
          uVar3 = curl_easy_strerror(ec_1);
          curl_mfprintf(uVar1,"%s:%d curl_easy_perform() failed with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1532.c"
                        ,0x2b,ec_1,uVar3);
        }
      }
    }
    curl_easy_cleanup(httpcode);
    curl_global_cleanup();
    URL_local._4_4_ = ec_1;
  }
  else {
    URL_local._4_4_ = ec_1;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  long httpcode;
  int res = CURLE_OK;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);

  res = curl_easy_perform(curl);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }

  res = curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &httpcode);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(httpcode != 200) {
    fprintf(stderr, "%s:%d unexpected response code %ld\n",
            __FILE__, __LINE__, httpcode);
    res = CURLE_HTTP_RETURNED_ERROR;
    goto test_cleanup;
  }

  /* Test for a regression of github bug 1017 (response code does not reset) */
  curl_easy_reset(curl);

  res = curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &httpcode);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(httpcode != 0) {
    fprintf(stderr, "%s:%d curl_easy_reset failed to zero the response code\n"
            "possible regression of github bug 1017\n", __FILE__, __LINE__);
    res = CURLE_HTTP_RETURNED_ERROR;
    goto test_cleanup;
  }

test_cleanup:
  curl_easy_cleanup(curl);
  curl_global_cleanup();
  return res;
}